

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass1.cpp
# Opt level: O0

void writeSymbolTable(string *path,
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
                     *symtab)

{
  byte bVar1;
  bool bVar2;
  _Setw _Var3;
  int iVar4;
  runtime_error *this;
  ostream *poVar5;
  reference pvVar6;
  undefined1 local_2d0 [8];
  value_type it;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_218;
  ofstream ofs;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
  *symtab_local;
  string *path_local;
  
  std::ofstream::ofstream(&local_218,(string *)path,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Writing SYMTAB to ");
    poVar5 = std::operator<<(poVar5,(string *)path);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ios_base::setf((ios_base *)((long)&local_218 + *(long *)(local_218 + -0x18)),_S_left);
    __range1._0_4_ = std::setw(0xc);
    poVar5 = std::operator<<((ostream *)&local_218,__range1._0_4_);
    poVar5 = std::operator<<(poVar5,"SYMBOL");
    poVar5 = std::operator<<(poVar5,"ADDRESS");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __end1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
             ::begin(symtab);
    it.second._32_8_ =
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
         ::end(symtab);
    while( true ) {
      bVar2 = std::__detail::operator!=
                        (&__end1.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_true>
                         ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_true>
                           *)&it.second.value);
      if (!bVar2) break;
      pvVar6 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_false,_true>
               ::operator*(&__end1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>
              *)local_2d0,pvVar6);
      _Var3 = std::setw(0xc);
      poVar5 = std::operator<<((ostream *)&local_218,_Var3);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::nouppercase);
      poVar5 = std::operator<<(poVar5,(string *)local_2d0);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::uppercase);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
      iVar4 = cs222::Symbol::getValue((Symbol *)((long)&it.first.field_2 + 8));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>
               *)local_2d0);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_false,_true>
      ::operator++(&__end1);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&local_218);
    return;
  }
  __range1._6_1_ = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_268,"Cannot open file: ",(allocator *)((long)&__range1 + 7));
  std::operator+(&local_248,&local_268,path);
  std::runtime_error::runtime_error(this,(string *)&local_248);
  __range1._6_1_ = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void writeSymbolTable(
        const std::string& path,
        const std::unordered_map<std::string, cs222::Symbol>& symtab)
{
    std::ofstream ofs(path);
    if (!ofs)
        throw std::runtime_error(std::string("Cannot open file: ") + path);

    std::cout << "Writing SYMTAB to " << path << std::endl;
    ofs.setf(std::ios::left);
    ofs << std::setw(12) << "SYMBOL" << "ADDRESS" << std::endl << std::endl;
    for (auto it : symtab)
    {
        ofs << std::setw(12) << std::nouppercase << it.first
            << std::uppercase << std::hex << it.second.getValue() << std::endl;
    }
    ofs.close();
}